

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lysp_stmt_case(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  ly_stmt stmt_00;
  lysp_node *plVar1;
  lyd_node *plVar2;
  LY_ERR LVar3;
  lysp_node *parent_00;
  lysp_node *plVar4;
  char *pcVar5;
  char *format;
  uint32_t substmt_index;
  ly_ctx *plVar6;
  char *in_R8;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_01;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar3 == LY_SUCCESS) {
    parent_00 = (lysp_node *)calloc(1,0x50);
    if (parent_00 == (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      in_R8 = "lysp_stmt_case";
      LVar3 = LY_EMEM;
      ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
    }
    else {
      plVar1 = *siblings;
      if (*siblings == (lysp_node *)0x0) {
        *siblings = parent_00;
      }
      else {
        do {
          plVar4 = plVar1;
          plVar1 = plVar4->next;
        } while (plVar1 != (lysp_node *)0x0);
        plVar4->next = parent_00;
      }
    }
    if (parent_00 != (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert(plVar6,stmt->arg,0,&parent_00->name);
      if (LVar3 == LY_SUCCESS) {
        parent_00->nodetype = 0x80;
        parent_00->parent = parent;
        stmt_01 = stmt->child;
        LVar3 = LY_SUCCESS;
        if (stmt_01 != (lysp_stmt *)0x0) {
          exts = &parent_00->exts;
          plVar1 = parent_00 + 1;
          do {
            stmt_00 = stmt_01->kw;
            if ((int)stmt_00 < 0x8000) {
              if ((int)stmt_00 < 0x400) {
                if (stmt_00 == LY_STMT_ANYDATA) {
                  plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  if (*(byte *)&plVar2[2].schema < 2) {
                    if (ctx == (lysp_ctx *)0x0) {
                      plVar6 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar6 = (ly_ctx *)**(undefined8 **)plVar2;
                    }
                    format = 
                    "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                    ;
                    pcVar5 = "anydata";
                    goto LAB_0016b923;
                  }
                }
                else if (stmt_00 != LY_STMT_ANYXML) {
                  if (stmt_00 != LY_STMT_CHOICE) goto LAB_0016b8b6;
                  LVar3 = lysp_stmt_choice(ctx,stmt_01,parent_00,&plVar1->parent);
                  goto LAB_0016b893;
                }
                LVar3 = lysp_stmt_any(ctx,stmt_01,parent_00,&plVar1->parent);
              }
              else if ((int)stmt_00 < 0x2000) {
                if (stmt_00 == LY_STMT_CONTAINER) {
                  LVar3 = lysp_stmt_container(ctx,stmt_01,parent_00,&plVar1->parent);
                }
                else {
                  if (stmt_00 != LY_STMT_LEAF) goto LAB_0016b8b6;
                  LVar3 = lysp_stmt_leaf(ctx,stmt_01,parent_00,&plVar1->parent);
                }
              }
              else if (stmt_00 == LY_STMT_LEAF_LIST) {
                LVar3 = lysp_stmt_leaflist(ctx,stmt_01,parent_00,&plVar1->parent);
              }
              else {
                if (stmt_00 != LY_STMT_LIST) goto LAB_0016b8b6;
                LVar3 = lysp_stmt_list(ctx,stmt_01,parent_00,&plVar1->parent);
              }
            }
            else if ((int)stmt_00 < 0x130000) {
              if (stmt_00 == LY_STMT_USES) {
                LVar3 = lysp_stmt_uses(ctx,stmt_01,parent_00,&plVar1->parent);
              }
              else {
                substmt_index = (int)parent_00 + 0x20;
                if (stmt_00 == LY_STMT_DESCRIPTION) {
LAB_0016b847:
                  in_R8 = (char *)exts;
                  LVar3 = lysp_stmt_text_field
                                    (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
                }
                else {
                  if (stmt_00 != LY_STMT_EXTENSION_INSTANCE) goto LAB_0016b8b6;
                  in_R8 = (char *)exts;
                  LVar3 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_CASE,0,exts);
                }
              }
            }
            else if ((int)stmt_00 < 0x2c0000) {
              if (stmt_00 != LY_STMT_IF_FEATURE) {
                substmt_index = (int)parent_00 + 0x28;
                if (stmt_00 == LY_STMT_REFERENCE) goto LAB_0016b847;
LAB_0016b8b6:
                if (ctx == (lysp_ctx *)0x0) {
                  plVar6 = (ly_ctx *)0x0;
                }
                else {
                  plVar6 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar5 = lyplg_ext_stmt2str(stmt_00);
                format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_0016b923:
                ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar5,"case");
                return LY_EVALID;
              }
              LVar3 = lysp_stmt_qnames(ctx,stmt_01,&parent_00->iffeatures,(yang_arg)exts,
                                       (lysp_ext_instance **)in_R8);
            }
            else if (stmt_00 == LY_STMT_STATUS) {
              LVar3 = lysp_stmt_status(ctx,stmt_01,&parent_00->flags,exts);
            }
            else {
              if (stmt_00 != LY_STMT_WHEN) goto LAB_0016b8b6;
              LVar3 = lysp_stmt_when(ctx,stmt_01,(lysp_when **)&parent_00[1].nodetype);
            }
LAB_0016b893:
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            stmt_01 = stmt_01->next;
            LVar3 = LY_SUCCESS;
          } while (stmt_01 != (lysp_stmt *)0x0);
        }
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_case(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node **siblings)
{
    struct lysp_node_case *cas;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new case structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, cas, next, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &cas->name));
    cas->nodetype = LYS_CASE;
    cas->parent = parent;

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &cas->dsc, Y_STR_ARG, &cas->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &cas->iffeatures, Y_STR_ARG, &cas->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &cas->ref, Y_STR_ARG, &cas->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &cas->flags, &cas->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &cas->when));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "case");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(lysp_stmt_any(ctx, child, &cas->node, &cas->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(lysp_stmt_choice(ctx, child, &cas->node, &cas->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(lysp_stmt_container(ctx, child, &cas->node, &cas->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(lysp_stmt_leaf(ctx, child, &cas->node, &cas->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(lysp_stmt_leaflist(ctx, child, &cas->node, &cas->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(lysp_stmt_list(ctx, child, &cas->node, &cas->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(lysp_stmt_uses(ctx, child, &cas->node, &cas->child));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_CASE, 0, &cas->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "case");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}